

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O1

size_t UpdateNodes(size_t num_bytes,size_t block_start,size_t pos,uint8_t *ringbuffer,
                  size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                  int *starting_dist_cache,size_t num_matches,BackwardMatch *matches,
                  ZopfliCostModel *model,StartPosQueue *queue,ZopfliNode *nodes)

{
  ulong uVar1;
  float fVar2;
  int iVar3;
  BackwardMatch BVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  anon_union_4_3_cc401a1e_for_u *paVar8;
  ulong uVar9;
  uint8_t *puVar10;
  byte bVar11;
  float fVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  uint8_t *puVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  ZopfliNode *in_stack_fffffffffffffef0;
  ulong uVar41;
  
  uVar1 = pos + block_start;
  uVar6 = uVar1 + params->stream_offset;
  if (max_backward_limit <= uVar6) {
    uVar6 = max_backward_limit;
  }
  uVar36 = num_bytes - pos;
  iVar3 = params->quality;
  uVar15 = 0x96;
  if (10 < iVar3) {
    uVar15 = 0x145;
  }
  EvaluateNode(params->stream_offset + block_start,pos,max_backward_limit,
               (size_t)starting_dist_cache,(int *)model,(ZopfliCostModel *)queue,
               (StartPosQueue *)nodes,in_stack_fffffffffffffef0);
  uVar7 = 2;
  if (pos + 2 <= num_bytes) {
    uVar7 = (ulong)((-(int)queue->idx_ & 7U) << 5);
    fVar39 = (model->literal_costs_[pos] -
             model->literal_costs_[*(long *)((long)queue->q_[0].distance_cache + (uVar7 - 8))]) +
             *(float *)((long)queue->q_[0].distance_cache + uVar7 + 0x14) + model->min_cost_cmd_;
    paVar8 = &nodes[pos + 2].u;
    lVar21 = 4;
    uVar25 = 10;
    uVar9 = 2;
    do {
      uVar7 = uVar9;
      if (fVar39 < paVar8->cost) break;
      uVar7 = uVar9 + 1;
      bVar37 = uVar7 == uVar25;
      fVar12 = fVar39 + 1.0;
      if (!bVar37) {
        fVar12 = fVar39;
      }
      fVar39 = fVar12;
      lVar29 = 0;
      if (bVar37) {
        lVar29 = lVar21;
      }
      lVar21 = lVar21 << bVar37;
      uVar25 = uVar25 + lVar29;
      paVar8 = paVar8 + 4;
      lVar29 = pos + uVar9;
      uVar9 = uVar7;
    } while (lVar29 + 1U <= num_bytes);
  }
  uVar9 = uVar1;
  if (uVar6 < uVar1) {
    uVar9 = uVar6;
  }
  puVar10 = ringbuffer + (uVar1 & ringbuffer_mask);
  uVar16 = (ulong)((uint)uVar36 & 7);
  uVar41 = 0;
  uVar25 = 0;
  do {
    uVar17 = queue->idx_;
    uVar22 = 8;
    if (uVar17 < 8) {
      uVar22 = uVar17;
    }
    if (uVar22 <= uVar25) {
      return uVar41;
    }
    uVar22 = (ulong)(((int)uVar25 - (int)uVar17 & 7U) << 5);
    uVar17 = pos - *(long *)((long)queue->q_[0].distance_cache + (uVar22 - 8));
    fVar12 = (float)uVar17;
    fVar39 = fVar12;
    if (5 < uVar17) {
      if (uVar17 < 0x82) {
        uVar20 = 0x1f;
        uVar13 = (uint)(uVar17 - 2);
        if (uVar13 != 0) {
          for (; uVar13 >> uVar20 == 0; uVar20 = uVar20 - 1) {
          }
        }
        fVar39 = (float)((int)(uVar17 - 2 >> ((char)(uVar20 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                         (uVar20 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (uVar17 < 0x842) {
        uVar20 = 0x1f;
        if ((int)fVar12 - 0x42U != 0) {
          for (; (int)fVar12 - 0x42U >> uVar20 == 0; uVar20 = uVar20 - 1) {
          }
        }
        fVar39 = (float)((uVar20 ^ 0xffe0) + 0x2a);
      }
      else {
        fVar39 = 2.94273e-44;
        if (0x1841 < uVar17) {
          fVar39 = (float)(uint)(ushort)(0x17 - (uVar17 < 0x5842));
        }
      }
    }
    uVar20 = (uint)fVar39 & 0xffff;
    fVar38 = (model->literal_costs_[pos] - *model->literal_costs_) +
             (float)kInsExtra[uVar20] +
             *(float *)((long)queue->q_[0].distance_cache + uVar22 + 0x10);
    if (uVar7 - 1 < uVar36) {
      uVar13 = uVar20 * 8 & 0x38;
      uVar27 = 0;
      uVar17 = uVar7 - 1;
      do {
        uVar34 = uVar17 + (uVar1 & ringbuffer_mask);
        if (((uVar34 <= ringbuffer_mask) &&
            (uVar26 = (long)kDistanceCacheOffset[uVar27] +
                      (long)*(int *)((long)queue->q_[0].distance_cache +
                                    (ulong)kDistanceCacheIndex[uVar27] * 4 + uVar22),
            uVar26 <= uVar9)) && (uVar1 - uVar26 < uVar1)) {
          uVar18 = uVar1 - uVar26 & ringbuffer_mask;
          if ((uVar18 + uVar17 <= ringbuffer_mask) &&
             (ringbuffer[uVar34] == ringbuffer[uVar18 + uVar17])) {
            if (7 < uVar36) {
              lVar21 = 0;
              uVar30 = 0;
LAB_00113975:
              if (*(ulong *)(puVar10 + uVar30 * 8) == *(ulong *)(ringbuffer + uVar30 * 8 + uVar18))
              goto code_r0x00113987;
              uVar30 = *(ulong *)(ringbuffer + uVar30 * 8 + uVar18) ^
                       *(ulong *)(puVar10 + uVar30 * 8);
              uVar18 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              uVar30 = (uVar18 >> 3 & 0x1fffffff) - lVar21;
              goto LAB_001139bb;
            }
            puVar23 = puVar10;
            uVar35 = 0;
LAB_00113b8d:
            uVar30 = uVar35;
            if (uVar16 != 0) {
              uVar31 = uVar16 | uVar35;
              uVar32 = uVar16;
              do {
                uVar30 = uVar35;
                if (ringbuffer[uVar35 + uVar18] != *puVar23) break;
                puVar23 = puVar23 + 1;
                uVar35 = uVar35 + 1;
                uVar32 = uVar32 - 1;
                uVar30 = uVar31;
              } while (uVar32 != 0);
            }
LAB_001139bb:
            if (uVar17 + 1 <= uVar30) {
              fVar2 = model->cost_dist_[uVar27];
              paVar8 = &nodes[pos + uVar17 + 1].u;
              uVar18 = uVar17;
              do {
                uVar17 = uVar18 + 1;
                iVar24 = (int)uVar18;
                if (uVar17 < 10) {
                  uVar14 = iVar24 - 1;
                }
                else if (uVar17 < 0x86) {
                  uVar14 = 0x1f;
                  uVar28 = (uint)(uVar18 - 5);
                  if (uVar28 != 0) {
                    for (; uVar28 >> uVar14 == 0; uVar14 = uVar14 - 1) {
                    }
                  }
                  uVar14 = (int)(uVar18 - 5 >> ((char)(uVar14 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                           (uVar14 ^ 0xffffffe0) * 2 + 0x42;
                }
                else {
                  uVar14 = 0x17;
                  if (uVar17 < 0x846) {
                    uVar14 = 0x1f;
                    if (iVar24 - 0x45U != 0) {
                      for (; iVar24 - 0x45U >> uVar14 == 0; uVar14 = uVar14 - 1) {
                      }
                    }
                    uVar14 = (uVar14 ^ 0xffe0) + 0x2c;
                  }
                }
                uVar28 = uVar14 & 7;
                if ((ushort)uVar14 < 0x10 && (uVar27 == 0 && SUB42(fVar39,0) < 8)) {
                  uVar5 = uVar28 | uVar13;
                  if (7 < (ushort)uVar14) {
                    uVar5 = uVar28 | uVar13 | 0x40;
                  }
                }
                else {
                  iVar33 = ((uVar14 & 0xffff) >> 3) + (uVar20 >> 3) * 3;
                  uVar5 = (uVar28 | uVar13) +
                          (0x520d40U >> ((char)iVar33 * '\x02' & 0x1fU) & 0xc0) + iVar33 * 0x40 +
                          0x40;
                }
                fVar40 = fVar38;
                if (0x7f < (uint)((ulong)uVar5 & 0xffff)) {
                  fVar40 = fVar2 + fVar38;
                }
                fVar40 = (float)kCopyExtra[uVar14 & 0xffff] + fVar40 +
                         model->cost_cmd_[(ulong)uVar5 & 0xffff];
                if (fVar40 < paVar8->cost) {
                  ((ZopfliNode *)(paVar8 + -3))->length = iVar24 + 1U | 0x12000000;
                  paVar8[-2].next = (uint32_t)(float)uVar26;
                  paVar8[-1].next = (uint)fVar12 | (int)uVar27 * 0x8000000 + 0x8000000U;
                  paVar8->cost = fVar40;
                  if (uVar41 <= uVar17) {
                    uVar41 = uVar17;
                  }
                }
                uVar35 = uVar18 + 2;
                paVar8 = paVar8 + 4;
                uVar18 = uVar17;
              } while (uVar35 <= uVar30);
            }
          }
        }
      } while (((uVar34 <= ringbuffer_mask) && (uVar27 < 0xf)) &&
              (uVar27 = uVar27 + 1, uVar17 < uVar36));
    }
    if (uVar25 < 2 && num_matches != 0) {
      sVar19 = 0;
      uVar17 = uVar7;
      do {
        BVar4 = matches[sVar19];
        uVar26 = (ulong)BVar4 & 0xffffffff;
        uVar27 = uVar26 + 0xf;
        uVar34 = (ulong)(params->dist).num_direct_distance_codes;
        uVar22 = uVar34 + 0x10;
        if (uVar22 <= uVar27) {
          uVar13 = (params->dist).distance_postfix_bits;
          bVar11 = (byte)uVar13;
          uVar27 = ~uVar34 + uVar26 + (4L << (bVar11 & 0x3f));
          uVar14 = 0x1f;
          uVar28 = (uint)uVar27;
          if (uVar28 != 0) {
            for (; uVar28 >> uVar14 == 0; uVar14 = uVar14 - 1) {
            }
          }
          uVar34 = (ulong)((uVar14 ^ 0xffffffe0) + 0x1f);
          lVar21 = uVar34 - uVar13;
          uVar27 = (~(-1 << (bVar11 & 0x1f)) & uVar28) + uVar22 +
                   ((ulong)((uVar27 >> (uVar34 & 0x3f) & 1) != 0) + lVar21 * 2 + -2 <<
                   (bVar11 & 0x3f)) | lVar21 * 0x400;
        }
        uVar34 = (ulong)BVar4 >> 0x25;
        uVar22 = uVar17;
        if (uVar15 < uVar34) {
          uVar22 = uVar34;
        }
        if (uVar6 < uVar26) {
          uVar22 = uVar34;
        }
        if (uVar34 <= uVar17) {
          uVar22 = uVar17;
        }
        uVar17 = uVar22;
        if (uVar17 <= uVar34) {
          fVar2 = model->cost_dist_[(uint)uVar27 & 0x3ff];
          uVar22 = (ulong)(BVar4.length_and_code & 0x1f);
          if (((ulong)BVar4 & 0x1f00000000) == 0) {
            uVar22 = uVar34;
          }
          paVar8 = &nodes[pos + uVar17].u;
          lVar21 = uVar17 * 0x2000000 + 0x12000000;
          do {
            uVar18 = uVar17;
            if (uVar6 < uVar26) {
              uVar18 = uVar22;
            }
            iVar24 = (int)uVar18;
            if (uVar18 < 10) {
              uVar13 = iVar24 - 2;
            }
            else if (uVar18 < 0x86) {
              uVar13 = 0x1f;
              uVar14 = (uint)(uVar18 - 6);
              if (uVar14 != 0) {
                for (; uVar14 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                }
              }
              uVar13 = (int)(uVar18 - 6 >> ((char)(uVar13 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar13 ^ 0xffffffe0) * 2 + 0x42;
            }
            else {
              uVar13 = 0x17;
              if (uVar18 < 0x846) {
                uVar13 = 0x1f;
                if (iVar24 - 0x46U != 0) {
                  for (; iVar24 - 0x46U >> uVar13 == 0; uVar13 = uVar13 - 1) {
                  }
                }
                uVar13 = (uVar13 ^ 0xffe0) + 0x2c;
              }
            }
            iVar33 = ((uVar13 & 0xffff) >> 3) + (uVar20 >> 3) * 3;
            fVar40 = (float)kCopyExtra[uVar13 & 0xffff] +
                     (float)((uint)(uVar27 >> 10) & 0x3f) + fVar38 + fVar2 +
                     model->cost_cmd_
                     [(uVar13 & 7 | ((uint)fVar39 & 7) << 3) +
                      (0x520d40U >> ((char)iVar33 * '\x02' & 0x1fU) & 0xc0) + iVar33 * 0x40 + 0x40 &
                      0xffff];
            if (fVar40 < paVar8->cost) {
              ((ZopfliNode *)(paVar8 + -3))->length =
                   (uint)uVar17 | (int)lVar21 + iVar24 * -0x2000000;
              paVar8[-2].next = BVar4.distance;
              paVar8[-1].next = (uint32_t)fVar12;
              paVar8->cost = fVar40;
              if (uVar41 <= uVar17) {
                uVar41 = uVar17;
              }
            }
            uVar17 = uVar17 + 1;
            paVar8 = paVar8 + 4;
            lVar21 = lVar21 + 0x2000000;
          } while (uVar34 + 1 != uVar17);
        }
        sVar19 = sVar19 + 1;
      } while (sVar19 != num_matches);
    }
    if (iVar3 < 0xb) {
      return uVar41;
    }
    bVar37 = 3 < uVar25;
    uVar25 = uVar25 + 1;
    if (bVar37) {
      return uVar41;
    }
  } while( true );
code_r0x00113987:
  uVar30 = uVar30 + 1;
  lVar21 = lVar21 + -8;
  puVar23 = puVar10 + (uVar36 & 0xfffffffffffffff8);
  uVar35 = uVar36 & 0xfffffffffffffff8;
  if (uVar36 >> 3 == uVar30) goto LAB_00113b8d;
  goto LAB_00113975;
}

Assistant:

static size_t UpdateNodes(
    const size_t num_bytes, const size_t block_start, const size_t pos,
    const uint8_t* ringbuffer, const size_t ringbuffer_mask,
    const BrotliEncoderParams* params, const size_t max_backward_limit,
    const int* starting_dist_cache, const size_t num_matches,
    const BackwardMatch* matches, const ZopfliCostModel* model,
    StartPosQueue* queue, ZopfliNode* nodes) {
  const size_t stream_offset = params->stream_offset;
  const size_t cur_ix = block_start + pos;
  const size_t cur_ix_masked = cur_ix & ringbuffer_mask;
  const size_t max_distance = BROTLI_MIN(size_t, cur_ix, max_backward_limit);
  const size_t dictionary_start = BROTLI_MIN(size_t,
      cur_ix + stream_offset, max_backward_limit);
  const size_t max_len = num_bytes - pos;
  const size_t max_zopfli_len = MaxZopfliLen(params);
  const size_t max_iters = MaxZopfliCandidates(params);
  size_t min_len;
  size_t result = 0;
  size_t k;
  size_t gap = 0;

  EvaluateNode(block_start + stream_offset, pos, max_backward_limit, gap,
      starting_dist_cache, model, queue, nodes);

  {
    const PosData* posdata = StartPosQueueAt(queue, 0);
    float min_cost = (posdata->cost + ZopfliCostModelGetMinCostCmd(model) +
        ZopfliCostModelGetLiteralCosts(model, posdata->pos, pos));
    min_len = ComputeMinimumCopyLength(min_cost, nodes, num_bytes, pos);
  }

  /* Go over the command starting positions in order of increasing cost
     difference. */
  for (k = 0; k < max_iters && k < StartPosQueueSize(queue); ++k) {
    const PosData* posdata = StartPosQueueAt(queue, k);
    const size_t start = posdata->pos;
    const uint16_t inscode = GetInsertLengthCode(pos - start);
    const float start_costdiff = posdata->costdiff;
    const float base_cost = start_costdiff + (float)GetInsertExtra(inscode) +
        ZopfliCostModelGetLiteralCosts(model, 0, pos);

    /* Look for last distance matches using the distance cache from this
       starting position. */
    size_t best_len = min_len - 1;
    size_t j = 0;
    for (; j < BROTLI_NUM_DISTANCE_SHORT_CODES && best_len < max_len; ++j) {
      const size_t idx = kDistanceCacheIndex[j];
      const size_t backward =
          (size_t)(posdata->distance_cache[idx] + kDistanceCacheOffset[j]);
      size_t prev_ix = cur_ix - backward;
      size_t len = 0;
      uint8_t continuation = ringbuffer[cur_ix_masked + best_len];
      if (cur_ix_masked + best_len > ringbuffer_mask) {
        break;
      }
      if (BROTLI_PREDICT_FALSE(backward > dictionary_start + gap)) {
        /* Word dictionary -> ignore. */
        continue;
      }
      if (backward <= max_distance) {
        /* Regular backward reference. */
        if (prev_ix >= cur_ix) {
          continue;
        }

        prev_ix &= ringbuffer_mask;
        if (prev_ix + best_len > ringbuffer_mask ||
            continuation != ringbuffer[prev_ix + best_len]) {
          continue;
        }
        len = FindMatchLengthWithLimit(&ringbuffer[prev_ix],
                                       &ringbuffer[cur_ix_masked],
                                       max_len);
      } else {
        /* "Gray" area. It is addressable by decoder, but this encoder
           instance does not have that data -> should not touch it. */
        continue;
      }
      {
        const float dist_cost = base_cost +
            ZopfliCostModelGetDistanceCost(model, j);
        size_t l;
        for (l = best_len + 1; l <= len; ++l) {
          const uint16_t copycode = GetCopyLengthCode(l);
          const uint16_t cmdcode =
              CombineLengthCodes(inscode, copycode, j == 0);
          const float cost = (cmdcode < 128 ? base_cost : dist_cost) +
              (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + l].u.cost) {
            UpdateZopfliNode(nodes, pos, start, l, l, backward, j + 1, cost);
            result = BROTLI_MAX(size_t, result, l);
          }
          best_len = l;
        }
      }
    }

    /* At higher iterations look only for new last distance matches, since
       looking only for new command start positions with the same distances
       does not help much. */
    if (k >= 2) continue;

    {
      /* Loop through all possible copy lengths at this position. */
      size_t len = min_len;
      for (j = 0; j < num_matches; ++j) {
        BackwardMatch match = matches[j];
        size_t dist = match.distance;
        BROTLI_BOOL is_dictionary_match =
            TO_BROTLI_BOOL(dist > dictionary_start + gap);
        /* We already tried all possible last distance matches, so we can use
           normal distance code here. */
        size_t dist_code = dist + BROTLI_NUM_DISTANCE_SHORT_CODES - 1;
        uint16_t dist_symbol;
        uint32_t distextra;
        uint32_t distnumextra;
        float dist_cost;
        size_t max_match_len;
        PrefixEncodeCopyDistance(
            dist_code, params->dist.num_direct_distance_codes,
            params->dist.distance_postfix_bits, &dist_symbol, &distextra);
        distnumextra = dist_symbol >> 10;
        dist_cost = base_cost + (float)distnumextra +
            ZopfliCostModelGetDistanceCost(model, dist_symbol & 0x3FF);

        /* Try all copy lengths up until the maximum copy length corresponding
           to this distance. If the distance refers to the static dictionary, or
           the maximum length is long enough, try only one maximum length. */
        max_match_len = BackwardMatchLength(&match);
        if (len < max_match_len &&
            (is_dictionary_match || max_match_len > max_zopfli_len)) {
          len = max_match_len;
        }
        for (; len <= max_match_len; ++len) {
          const size_t len_code =
              is_dictionary_match ? BackwardMatchLengthCode(&match) : len;
          const uint16_t copycode = GetCopyLengthCode(len_code);
          const uint16_t cmdcode = CombineLengthCodes(inscode, copycode, 0);
          const float cost = dist_cost + (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + len].u.cost) {
            UpdateZopfliNode(nodes, pos, start, len, len_code, dist, 0, cost);
            result = BROTLI_MAX(size_t, result, len);
          }
        }
      }
    }
  }
  return result;
}